

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Tree::resolve_tags(Tree *this)

{
  long lVar1;
  size_t sVar2;
  size_t *psVar3;
  
  if (this->m_size != 0) {
    psVar3 = &this->m_tag_directives[0].handle.len;
    lVar1 = 0;
    do {
      if ((*psVar3 == 0) || (((csubstr *)(psVar3 + -1))->str == (char *)0x0)) goto LAB_001ca9c2;
      lVar1 = lVar1 + 1;
      psVar3 = psVar3 + 5;
    } while (lVar1 != 4);
    lVar1 = 4;
LAB_001ca9c2:
    if (lVar1 != 0) {
      sVar2 = root_id(this);
      sVar2 = anon_unknown_0::_count_resolved_tags_size(this,sVar2);
      if (sVar2 != 0) {
        reserve_arena(this,sVar2 + this->m_arena_pos);
      }
      sVar2 = root_id(this);
      anon_unknown_0::_resolve_tags(this,sVar2);
      return;
    }
  }
  return;
}

Assistant:

inline bool   empty() const { return m_size == 0; }